

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

void __thiscall llbuild::buildsystem::BuildKey::BuildKey(BuildKey *this,char kindCode,StringRef str)

{
  iterator __first;
  iterator __last;
  KeyType local_70;
  undefined1 local_50 [8];
  string encodedKey;
  char kindCode_local;
  BuildKey *this_local;
  StringRef str_local;
  
  str_local.Data = (char *)str.Length;
  this_local = (BuildKey *)str.Data;
  encodedKey.field_2._M_local_buf[0xf] = kindCode;
  core::KeyType::KeyType(&this->key);
  std::__cxx11::string::string((string *)local_50);
  str_local.Length = (size_t)&this_local;
  std::__cxx11::string::reserve((ulong)local_50);
  std::__cxx11::string::push_back((char)local_50);
  __first = llvm::StringRef::begin((StringRef *)&this_local);
  __last = llvm::StringRef::end((StringRef *)&this_local);
  std::__cxx11::string::append<char_const*,void>((string *)local_50,__first,__last);
  core::KeyType::KeyType(&local_70,(string *)local_50);
  core::KeyType::operator=(&this->key,&local_70);
  core::KeyType::~KeyType(&local_70);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

BuildKey(char kindCode, StringRef str) {
    std::string encodedKey;
    encodedKey.reserve(1 + str.size());
    encodedKey.push_back(kindCode);
    encodedKey.append(str.begin(), str.end());
    key = encodedKey;
  }